

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void __thiscall
Js::ScriptContext::LogDataForFunctionBody
          (ScriptContext *this,FunctionBody *body,uint idx,bool isRejit)

{
  bool bVar1;
  Recycler *pRVar2;
  RejitStatsMap *addr;
  RejitStats *this_00;
  BailoutStatsMap *this_01;
  undefined **local_58;
  RejitStats *stats;
  size_t local_48;
  char *local_40;
  DWORD local_38;
  uint local_30;
  uint local_2c [2];
  uint idx_local;
  
  local_2c[0] = idx;
  if (this->rejitStatsMap == (RejitStatsMap *)0x0) {
    local_58 = &JsUtil::
                WeaklyReferencedKeyDictionary<Js::FunctionBody_const,Js::ScriptContext::RejitStats*,DefaultComparer<Js::FunctionBody_const*>,true>
                ::typeinfo;
    stats = (RejitStats *)0x0;
    local_48 = 0xffffffffffffffff;
    local_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
    ;
    local_38 = 0x18b4;
    pRVar2 = Memory::Recycler::TrackAllocInfo
                       (this->recycler,(TrackAllocData *)&stack0xffffffffffffffa8);
    addr = (RejitStatsMap *)new<Memory::Recycler>(0x50,pRVar2,0x38bbb2);
    pRVar2 = this->recycler;
    addr->size = 0;
    addr->count = 0;
    addr->version = 0;
    addr->freeList = 0;
    addr->freeCount = 0;
    (addr->buckets).ptr = (int *)0x0;
    (addr->entries).ptr =
         (WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
          *)0x0;
    addr->recycler = pRVar2;
    (addr->entryRemovalCallback).cookie.ptr = (void *)0x0;
    addr->lastWeakReferenceCleanupId = pRVar2->weakReferenceCleanupId;
    addr->disableCleanup = false;
    addr->modFunctionIndex = 0x4b;
    (addr->entryRemovalCallback).fnCallback = (Type)0x0;
    this->rejitStatsMap = addr;
    BindReference(this,addr);
  }
  local_58 = (undefined **)0x0;
  bVar1 = JsUtil::
          WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
          ::TryGetValue(this->rejitStatsMap,body,(RejitStats **)&stack0xffffffffffffffa8);
  if (!bVar1) {
    this_00 = (RejitStats *)new<Memory::ArenaAllocator>(0x18,&this->generalAllocator,0x366bee);
    RejitStats::RejitStats(this_00,this);
    local_58 = (undefined **)this_00;
    JsUtil::
    WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
    ::Insert(this->rejitStatsMap,body,this_00,false,true);
  }
  if (isRejit) {
    ((RejitStats *)local_58)->m_rejitReasonCounts[local_2c[0]] =
         ((RejitStats *)local_58)->m_rejitReasonCounts[local_2c[0]] + 1;
  }
  else {
    bVar1 = JsUtil::
            BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey(((RejitStats *)local_58)->m_bailoutReasonCounts,local_2c);
    if (bVar1) {
      local_30 = JsUtil::
                 BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::Item(((RejitStats *)local_58)->m_bailoutReasonCounts,local_2c);
      local_30 = local_30 + 1;
      this_01 = ((RejitStats *)local_58)->m_bailoutReasonCounts;
    }
    else {
      this_01 = ((RejitStats *)local_58)->m_bailoutReasonCounts;
      local_30 = 1;
    }
    JsUtil::
    BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
              ((BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this_01,local_2c,&local_30);
  }
  return;
}

Assistant:

void ScriptContext::LogDataForFunctionBody(Js::FunctionBody *body, uint idx, bool isRejit)
    {
        if (rejitStatsMap == NULL)
        {
            rejitStatsMap = RecyclerNew(this->recycler, RejitStatsMap, this->recycler);
            BindReference(rejitStatsMap);
        }

        RejitStats *stats = NULL;
        if (!rejitStatsMap->TryGetValue(body, &stats))
        {
            stats = Anew(GeneralAllocator(), RejitStats, this);
            rejitStatsMap->Item(body, stats);
        }

        if (isRejit)
        {
            stats->m_rejitReasonCounts[idx]++;
        }
        else
        {
            if (!stats->m_bailoutReasonCounts->ContainsKey(idx))
            {
                stats->m_bailoutReasonCounts->Item(idx, 1);
            }
            else
            {
                uint val = stats->m_bailoutReasonCounts->Item(idx);
                ++val;
                stats->m_bailoutReasonCounts->Item(idx, val);
            }
        }
    }